

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

int intra_mode_info_cost_uv
              (AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mbmi,BLOCK_SIZE bsize,int mode_cost)

{
  byte mode;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  PALETTE_MODE_INFO *pmi_00;
  BLOCK_SIZE in_CL;
  BLOCK_SIZE *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  PREDICTION_MODE intra_mode;
  int n_cache;
  uint16_t color_cache [16];
  int palette_mode_cost;
  uint8_t *color_map;
  MACROBLOCKD *xd;
  int plt_size;
  int bsize_ctx;
  PALETTE_MODE_INFO *pmi;
  int try_palette;
  UV_PREDICTION_MODE uv_mode;
  int use_palette;
  ModeCosts *mode_costs;
  int total_rate;
  int in_stack_ffffffffffffff70;
  COLOR_MAP_TYPE in_stack_ffffffffffffff99;
  TX_SIZE in_stack_ffffffffffffff9a;
  BLOCK_SIZE in_stack_ffffffffffffff9b;
  MACROBLOCK *x_00;
  int in_stack_ffffffffffffffc0;
  undefined3 in_stack_ffffffffffffffc8;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffd8;
  
  pmi_00 = (PALETTE_MODE_INFO *)(in_RSI + 0x4230);
  uVar1 = (uint)(in_RDX[0x8f] != BLOCK_4X4);
  uVar5 = CONCAT13(in_RDX[3],in_stack_ffffffffffffffc8);
  iVar2 = av1_allow_palette((uint)(*(byte *)(in_RDI + 0x3c16f) & 1),*in_RDX);
  if (((iVar2 != 0) && ((char)((uint)uVar5 >> 0x18) == '\0')) &&
     (in_R8D = *(int *)(pmi_00[0x136].palette_colors +
                       (long)(int)(uint)(in_RDX[0x8e] != BLOCK_4X4) * 4 + (long)(int)uVar1 * 2 + 2)
               + in_R8D, uVar1 != 0)) {
    iVar3 = av1_get_palette_bsize_ctx(in_CL);
    x_00 = *(MACROBLOCK **)(in_RSI + 0xc80);
    iVar3 = *(int *)(pmi_00[0x102].palette_colors +
                    (long)iVar3 * 0xe + (long)(int)(in_RDX[0x8f] - 2) * 2);
    iVar4 = write_uniform_cost(in_stack_ffffffffffffff70,iVar3);
    iVar3 = iVar3 + iVar4;
    av1_get_palette_cache
              ((MACROBLOCKD *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
               (int)((ulong)pmi_00 >> 0x20),(uint16_t *)CONCAT44(uVar1,uVar5));
    iVar2 = av1_palette_color_cost_uv
                      (pmi_00,(uint16_t *)CONCAT44(uVar1,uVar5),iVar2,in_stack_ffffffffffffffc0);
    iVar2 = iVar2 + iVar3;
    iVar3 = av1_cost_color_map(x_00,iVar2,in_stack_ffffffffffffff9b,in_stack_ffffffffffffff9a,
                               in_stack_ffffffffffffff99);
    in_R8D = iVar3 + iVar2 + in_R8D;
  }
  mode = get_uv_mode((UV_PREDICTION_MODE)((uint)uVar5 >> 0x18));
  iVar2 = av1_is_directional_mode(mode);
  if ((iVar2 != 0) && (iVar2 = av1_use_angle_delta(in_CL), iVar2 != 0)) {
    in_R8D = *(int *)(pmi_00[0xe4].palette_size +
                     (long)((char)in_RDX[0x59] + 3) * 4 + (long)(int)(mode - 1) * 0x1c) + in_R8D;
  }
  return in_R8D;
}

Assistant:

static inline int intra_mode_info_cost_uv(const AV1_COMP *cpi,
                                          const MACROBLOCK *x,
                                          const MB_MODE_INFO *mbmi,
                                          BLOCK_SIZE bsize, int mode_cost) {
  int total_rate = mode_cost;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int use_palette = mbmi->palette_mode_info.palette_size[1] > 0;
  const UV_PREDICTION_MODE uv_mode = mbmi->uv_mode;
  // Can only activate one mode.
  assert(((uv_mode != UV_DC_PRED) + use_palette + mbmi->use_intrabc) <= 1);

  const int try_palette = av1_allow_palette(
      cpi->common.features.allow_screen_content_tools, mbmi->bsize);
  if (try_palette && uv_mode == UV_DC_PRED) {
    const PALETTE_MODE_INFO *pmi = &mbmi->palette_mode_info;
    total_rate +=
        mode_costs->palette_uv_mode_cost[pmi->palette_size[0] > 0][use_palette];
    if (use_palette) {
      const int bsize_ctx = av1_get_palette_bsize_ctx(bsize);
      const int plt_size = pmi->palette_size[1];
      const MACROBLOCKD *xd = &x->e_mbd;
      const uint8_t *const color_map = xd->plane[1].color_index_map;
      int palette_mode_cost =
          mode_costs
              ->palette_uv_size_cost[bsize_ctx][plt_size - PALETTE_MIN_SIZE] +
          write_uniform_cost(plt_size, color_map[0]);
      uint16_t color_cache[2 * PALETTE_MAX_SIZE];
      const int n_cache = av1_get_palette_cache(xd, 1, color_cache);
      palette_mode_cost += av1_palette_color_cost_uv(
          pmi, color_cache, n_cache, cpi->common.seq_params->bit_depth);
      palette_mode_cost +=
          av1_cost_color_map(x, 1, bsize, mbmi->tx_size, PALETTE_MAP);
      total_rate += palette_mode_cost;
    }
  }
  const PREDICTION_MODE intra_mode = get_uv_mode(uv_mode);
  if (av1_is_directional_mode(intra_mode)) {
    if (av1_use_angle_delta(bsize)) {
      total_rate +=
          mode_costs->angle_delta_cost[intra_mode - V_PRED]
                                      [mbmi->angle_delta[PLANE_TYPE_UV] +
                                       MAX_ANGLE_DELTA];
    }
  }
  return total_rate;
}